

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

void tcmalloc::AddToFreelist(void *v,Arena *arena)

{
  AllocList *e;
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  AllocList *local_118;
  AllocList *prev [30];
  
  e = (AllocList *)((long)v + -0x20);
  if ((*(ulong *)((long)v + -0x18) ^ (ulong)e) == 0x4c833e95) {
    if (*(Arena **)((long)v + -0x10) == arena) {
      iVar1 = LLA_SkiplistLevels(*(size_t *)((long)v + -0x20),arena->min_size,true);
      *(int *)v = iVar1;
      LLA_SkiplistInsert(&arena->freelist,e,&local_118);
      *(ulong *)((long)v + -0x18) = (ulong)e ^ 0xffffffffb37cc16a;
      Coalesce(e);
      Coalesce(local_118);
      return;
    }
    pcVar3 = "Check failed: f->header.arena == arena: bad arena pointer in AddToFreelist()\n";
    uVar2 = 0x4d;
  }
  else {
    pcVar3 = 
    "Check failed: f->header.magic == Magic(kMagicAllocated, &f->header): bad magic number in AddToFreelist()\n"
    ;
    uVar2 = 0x69;
  }
  syscall(1,2,pcVar3,uVar2);
  abort();
}

Assistant:

static void AddToFreelist(void *v, LowLevelAlloc::Arena *arena) {
  AllocList *f = reinterpret_cast<AllocList *>(
                        reinterpret_cast<char *>(v) - sizeof (f->header));
  RAW_CHECK(f->header.magic == Magic(kMagicAllocated, &f->header),
            "bad magic number in AddToFreelist()");
  RAW_CHECK(f->header.arena == arena,
            "bad arena pointer in AddToFreelist()");
  f->levels = LLA_SkiplistLevels(f->header.size, arena->min_size, true);
  AllocList *prev[kMaxLevel];
  LLA_SkiplistInsert(&arena->freelist, f, prev);
  f->header.magic = Magic(kMagicUnallocated, &f->header);
  Coalesce(f);                  // maybe coalesce with successor
  Coalesce(prev[0]);            // maybe coalesce with predecessor
}